

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

void cdef_filter_16_2_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  int iVar113;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  v128 res_128;
  v256_conflict tap [8];
  int *sec_taps;
  int *pri_taps;
  int s2o2;
  int s2o1;
  int s1o2;
  int s1o1;
  int po2;
  int po1;
  v256_conflict min;
  v256_conflict max;
  v256_conflict cdef_large_value_mask;
  v256_conflict res;
  v256_conflict row;
  v256_conflict p3;
  v256_conflict p2;
  v256_conflict p1;
  v256_conflict p0;
  v256_conflict sum;
  int i;
  int clipping_required;
  uint16_t *dst16;
  uint8_t *dst8;
  v128 res_128_1;
  v256_conflict tap_2 [8];
  v256_conflict tap_1 [4];
  int i_1;
  int *sec_taps_1;
  int *pri_taps_1;
  int s2o2_1;
  int s2o1_1;
  int s1o2_1;
  int s1o1_1;
  int po2_1;
  int po1_1;
  v256_conflict cdef_large_value_mask_1;
  v256_conflict min_1;
  v256_conflict max_1;
  v256_conflict res_1;
  v256_conflict row_1;
  v256_conflict sum_1;
  v256_conflict p3_1;
  v256_conflict p2_1;
  v256_conflict p1_1;
  v256_conflict p0_1;
  int clipping_required_1;
  uint16_t *dst16_1;
  uint8_t *dst8_1;
  v256_conflict s_15;
  v256_conflict sign_15;
  v256_conflict diff_15;
  v256_conflict s_14;
  v256_conflict sign_14;
  v256_conflict diff_14;
  v256_conflict s_13;
  v256_conflict sign_13;
  v256_conflict diff_13;
  v256_conflict s_12;
  v256_conflict sign_12;
  v256_conflict diff_12;
  v256_conflict s_23;
  v256_conflict sign_23;
  v256_conflict diff_23;
  v256_conflict s_22;
  v256_conflict sign_22;
  v256_conflict diff_22;
  v256_conflict s_21;
  v256_conflict sign_21;
  v256_conflict diff_21;
  v256_conflict s_20;
  v256_conflict sign_20;
  v256_conflict diff_20;
  v256_conflict s_19;
  v256_conflict sign_19;
  v256_conflict diff_19;
  v256_conflict s_18;
  v256_conflict sign_18;
  v256_conflict diff_18;
  v256_conflict s_17;
  v256_conflict sign_17;
  v256_conflict diff_17;
  v256_conflict s_16;
  v256_conflict sign_16;
  v256_conflict diff_16;
  v256_conflict s_3;
  v256_conflict sign_3;
  v256_conflict diff_3;
  v256_conflict s_2;
  v256_conflict sign_2;
  v256_conflict diff_2;
  v256_conflict s_1;
  v256_conflict sign_1;
  v256_conflict diff_1;
  v256_conflict s;
  v256_conflict sign;
  v256_conflict diff;
  v256_conflict s_11;
  v256_conflict sign_11;
  v256_conflict diff_11;
  v256_conflict s_10;
  v256_conflict sign_10;
  v256_conflict diff_10;
  v256_conflict s_9;
  v256_conflict sign_9;
  v256_conflict diff_9;
  v256_conflict s_8;
  v256_conflict sign_8;
  v256_conflict diff_8;
  v256_conflict s_7;
  v256_conflict sign_7;
  v256_conflict diff_7;
  v256_conflict s_6;
  v256_conflict sign_6;
  v256_conflict diff_6;
  v256_conflict s_5;
  v256_conflict sign_5;
  v256_conflict diff_5;
  v256_conflict s_4;
  v256_conflict sign_4;
  v256_conflict diff_4;
  v256_conflict max_u8_2;
  v256_conflict max_u8;
  v256_conflict max_u8_3;
  v256_conflict max_u8_1;
  uint local_e2ac;
  uint local_e26c;
  undefined8 local_e080;
  undefined8 uStack_e078;
  undefined8 *puStack_e068;
  undefined8 uStack_e050;
  undefined8 uStack_e048;
  undefined1 local_dfc0 [32];
  int local_df90;
  uint local_df64;
  int local_dccc;
  undefined8 uStack_dc10;
  undefined8 uStack_dc08;
  undefined1 local_dc00 [32];
  uint local_db24;
  undefined8 local_dad0;
  undefined8 uStack_dac8;
  undefined8 local_d8b0;
  undefined8 uStack_d8a8;
  undefined8 local_d880;
  undefined8 uStack_d878;
  undefined8 local_d850;
  undefined8 uStack_d848;
  undefined8 local_d820;
  undefined8 uStack_d818;
  undefined8 local_d7f0;
  undefined8 uStack_d7e8;
  undefined8 local_d7c0;
  undefined8 uStack_d7b8;
  undefined8 local_d790;
  undefined8 uStack_d788;
  undefined8 local_d760;
  undefined8 uStack_d758;
  ulong local_d360;
  ulong uStack_d358;
  ulong uStack_d350;
  ulong uStack_d348;
  ulong local_d280;
  ulong uStack_d278;
  ulong uStack_d270;
  ulong uStack_d268;
  ulong local_d1a0;
  ulong uStack_d198;
  ulong uStack_d190;
  ulong uStack_d188;
  ulong local_d0c0;
  ulong uStack_d0b8;
  ulong uStack_d0b0;
  ulong uStack_d0a8;
  ulong local_cfe0;
  ulong uStack_cfd8;
  ulong uStack_cfd0;
  ulong uStack_cfc8;
  ulong local_cf00;
  ulong uStack_cef8;
  ulong uStack_cef0;
  ulong uStack_cee8;
  ulong local_ce20;
  ulong uStack_ce18;
  ulong uStack_ce10;
  ulong uStack_ce08;
  ulong local_cd40;
  ulong uStack_cd38;
  ulong uStack_cd30;
  ulong uStack_cd28;
  ulong local_c8e0;
  ulong uStack_c8d8;
  ulong uStack_c8d0;
  ulong uStack_c8c8;
  ulong local_c800;
  ulong uStack_c7f8;
  ulong uStack_c7f0;
  ulong uStack_c7e8;
  ulong local_c720;
  ulong uStack_c718;
  ulong uStack_c710;
  ulong uStack_c708;
  ulong local_c640;
  ulong uStack_c638;
  ulong uStack_c630;
  ulong uStack_c628;
  ulong local_c560;
  ulong uStack_c558;
  ulong uStack_c550;
  ulong uStack_c548;
  ulong local_c480;
  ulong uStack_c478;
  ulong uStack_c470;
  ulong uStack_c468;
  ulong local_c3a0;
  ulong uStack_c398;
  ulong uStack_c390;
  ulong uStack_c388;
  ulong local_c2c0;
  ulong uStack_c2b8;
  ulong uStack_c2b0;
  ulong uStack_c2a8;
  ushort local_c264;
  undefined8 local_93c0;
  undefined8 local_9380;
  undefined8 local_9340;
  undefined8 local_9300;
  undefined1 local_9210 [16];
  undefined8 local_9160;
  undefined8 uStack_9158;
  ulong uStack_9078;
  ulong uStack_9038;
  ulong local_74c0;
  ulong uStack_74b8;
  ulong uStack_74b0;
  ulong uStack_74a8;
  ulong local_7480;
  ulong uStack_7478;
  ulong uStack_7470;
  ulong uStack_7468;
  ulong local_7440;
  ulong uStack_7438;
  ulong uStack_7430;
  ulong uStack_7428;
  ulong local_7400;
  ulong uStack_73f8;
  ulong uStack_73f0;
  ulong uStack_73e8;
  ulong local_73c0;
  ulong uStack_73b8;
  ulong uStack_73b0;
  ulong uStack_73a8;
  ulong local_7380;
  ulong uStack_7378;
  ulong uStack_7370;
  ulong uStack_7368;
  ulong local_7340;
  ulong uStack_7338;
  ulong uStack_7330;
  ulong uStack_7328;
  ulong local_7300;
  ulong uStack_72f8;
  ulong uStack_72f0;
  ulong uStack_72e8;
  ulong local_71c0;
  ulong uStack_71b8;
  ulong uStack_71b0;
  ulong uStack_71a8;
  ulong local_7180;
  ulong uStack_7178;
  ulong uStack_7170;
  ulong uStack_7168;
  ulong local_7140;
  ulong uStack_7138;
  ulong uStack_7130;
  ulong uStack_7128;
  ulong local_7100;
  ulong uStack_70f8;
  ulong uStack_70f0;
  ulong uStack_70e8;
  ulong local_70c0;
  ulong uStack_70b8;
  ulong uStack_70b0;
  ulong uStack_70a8;
  ulong local_7080;
  ulong uStack_7078;
  ulong uStack_7070;
  ulong uStack_7068;
  ulong local_7040;
  ulong uStack_7038;
  ulong uStack_7030;
  ulong uStack_7028;
  ulong local_7000;
  ulong uStack_6ff8;
  ulong uStack_6ff0;
  ulong uStack_6fe8;
  ulong uStack_1d38;
  undefined8 local_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 local_1a10;
  undefined8 uStack_1a08;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 local_1930;
  undefined8 uStack_1928;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 local_1850;
  undefined8 uStack_1848;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  
  local_c264 = (ushort)in_R8D;
  if (coeff_shift == 8) {
    auVar115 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,2);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,3);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,4);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,5);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,6);
    vpinsrw_avx(auVar115,0xbfff,7);
    auVar115 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,2);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,3);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,4);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,5);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,6);
    vpinsrw_avx(auVar115,0xbfff,7);
    iVar2 = cdef_directions_padded[(long)(in_R9D + 2) + 2][0];
    iVar3 = cdef_directions_padded[(long)(in_R9D + 2) + 2][1];
    iVar4 = cdef_directions_padded[(long)(in_R9D + -2) + 2][0];
    iVar5 = cdef_directions_padded[(long)(in_R9D + -2) + 2][1];
    local_df64 = pri_damping;
    if (in_R8D != 0) {
      iVar113 = get_msb(in_R8D);
      if (pri_damping - iVar113 < 0) {
        local_e26c = 0;
      }
      else {
        iVar113 = get_msb(in_R8D);
        local_e26c = pri_damping - iVar113;
      }
      local_df64 = local_e26c;
    }
    for (local_df90 = 0; local_df90 < block_width; local_df90 = local_df90 + 2) {
      local_dfc0 = ZEXT1632(ZEXT816(0));
      auVar115 = *(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90) * 2);
      auVar114 = ZEXT116(0) * auVar115 +
                 ZEXT116(1) * *(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + 0x90) * 2);
      auVar115 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar115;
      uStack_e050 = auVar115._0_8_;
      uStack_e048 = auVar115._8_8_;
      auVar115 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar2) * 2));
      auVar6 = vlddqu_avx(*(undefined1 (*) [16])
                           (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar2) * 2));
      local_d760 = auVar115._0_8_;
      uStack_d758 = auVar115._8_8_;
      auVar115 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar2) * 2));
      auVar116 = vlddqu_avx(*(undefined1 (*) [16])
                             (in_RDX + (long)((local_df90 * 0x90 - iVar2) + 0x90) * 2));
      local_d790 = auVar115._0_8_;
      uStack_d788 = auVar115._8_8_;
      auVar115 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar4) * 2));
      auVar117 = vlddqu_avx(*(undefined1 (*) [16])
                             (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar4) * 2));
      local_d7c0 = auVar115._0_8_;
      uStack_d7b8 = auVar115._8_8_;
      auVar115 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar4) * 2));
      auVar7 = vlddqu_avx(*(undefined1 (*) [16])
                           (in_RDX + (long)((local_df90 * 0x90 - iVar4) + 0x90) * 2));
      local_d7f0 = auVar115._0_8_;
      uStack_d7e8 = auVar115._8_8_;
      auVar13._16_8_ = local_d760;
      auVar13._0_16_ = auVar6;
      auVar13._24_8_ = uStack_d758;
      auVar12._16_8_ = uStack_e050;
      auVar12._0_16_ = auVar114;
      auVar12._24_8_ = uStack_e048;
      auVar11 = vpsubw_avx2(auVar13,auVar12);
      auVar8 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_930 = auVar6._0_8_;
      uStack_928 = auVar6._8_8_;
      auVar9 = vpsrlw_avx2(auVar11,ZEXT416(local_df64));
      auVar55._16_8_ = uStack_930;
      auVar55._0_16_ = auVar115;
      auVar55._24_8_ = uStack_928;
      auVar9 = vpsubusw_avx2(auVar55,auVar9);
      local_c2c0 = auVar8._0_8_;
      uStack_c2b8 = auVar8._8_8_;
      uStack_c2b0 = auVar8._16_8_;
      uStack_c2a8 = auVar8._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar9);
      auVar11 = vpaddw_avx2(auVar8,auVar11);
      local_74c0 = auVar11._0_8_;
      uStack_74b8 = auVar11._8_8_;
      uStack_74b0 = auVar11._16_8_;
      uStack_74a8 = auVar11._24_8_;
      auVar15._16_8_ = local_d790;
      auVar15._0_16_ = auVar116;
      auVar15._24_8_ = uStack_d788;
      auVar14._16_8_ = uStack_e050;
      auVar14._0_16_ = auVar114;
      auVar14._24_8_ = uStack_e048;
      auVar11 = vpsubw_avx2(auVar15,auVar14);
      auVar8 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_8f0 = auVar6._0_8_;
      uStack_8e8 = auVar6._8_8_;
      auVar9 = vpsrlw_avx2(auVar11,ZEXT416(local_df64));
      auVar54._16_8_ = uStack_8f0;
      auVar54._0_16_ = auVar115;
      auVar54._24_8_ = uStack_8e8;
      auVar9 = vpsubusw_avx2(auVar54,auVar9);
      local_c3a0 = auVar8._0_8_;
      uStack_c398 = auVar8._8_8_;
      uStack_c390 = auVar8._16_8_;
      uStack_c388 = auVar8._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar9);
      auVar11 = vpaddw_avx2(auVar8,auVar11);
      local_7480 = auVar11._0_8_;
      uStack_7478 = auVar11._8_8_;
      uStack_7470 = auVar11._16_8_;
      uStack_7468 = auVar11._24_8_;
      auVar17._16_8_ = local_d7c0;
      auVar17._0_16_ = auVar117;
      auVar17._24_8_ = uStack_d7b8;
      auVar16._16_8_ = uStack_e050;
      auVar16._0_16_ = auVar114;
      auVar16._24_8_ = uStack_e048;
      auVar11 = vpsubw_avx2(auVar17,auVar16);
      auVar8 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_8b0 = auVar6._0_8_;
      uStack_8a8 = auVar6._8_8_;
      auVar9 = vpsrlw_avx2(auVar11,ZEXT416(local_df64));
      auVar53._16_8_ = uStack_8b0;
      auVar53._0_16_ = auVar115;
      auVar53._24_8_ = uStack_8a8;
      auVar9 = vpsubusw_avx2(auVar53,auVar9);
      local_c480 = auVar8._0_8_;
      uStack_c478 = auVar8._8_8_;
      uStack_c470 = auVar8._16_8_;
      uStack_c468 = auVar8._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar9);
      auVar11 = vpaddw_avx2(auVar8,auVar11);
      local_7440 = auVar11._0_8_;
      uStack_7438 = auVar11._8_8_;
      uStack_7430 = auVar11._16_8_;
      uStack_7428 = auVar11._24_8_;
      auVar19._16_8_ = local_d7f0;
      auVar19._0_16_ = auVar7;
      auVar19._24_8_ = uStack_d7e8;
      auVar18._16_8_ = uStack_e050;
      auVar18._0_16_ = auVar114;
      auVar18._24_8_ = uStack_e048;
      auVar11 = vpsubw_avx2(auVar19,auVar18);
      auVar8 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_870 = auVar6._0_8_;
      uStack_868 = auVar6._8_8_;
      auVar9 = vpsrlw_avx2(auVar11,ZEXT416(local_df64));
      auVar52._16_8_ = uStack_870;
      auVar52._0_16_ = auVar115;
      auVar52._24_8_ = uStack_868;
      auVar9 = vpsubusw_avx2(auVar52,auVar9);
      local_c560 = auVar8._0_8_;
      uStack_c558 = auVar8._8_8_;
      uStack_c550 = auVar8._16_8_;
      uStack_c548 = auVar8._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar9);
      auVar11 = vpaddw_avx2(auVar8,auVar11);
      local_7400 = auVar11._0_8_;
      uStack_73f8 = auVar11._8_8_;
      uStack_73f0 = auVar11._16_8_;
      uStack_73e8 = auVar11._24_8_;
      auVar115 = vpinsrw_avx(ZEXT216(2),2,1);
      auVar115 = vpinsrw_avx(auVar115,2,2);
      auVar115 = vpinsrw_avx(auVar115,2,3);
      auVar115 = vpinsrw_avx(auVar115,2,4);
      auVar115 = vpinsrw_avx(auVar115,2,5);
      auVar115 = vpinsrw_avx(auVar115,2,6);
      auVar115 = vpinsrw_avx(auVar115,2,7);
      auVar6 = vpinsrw_avx(ZEXT216(2),2,1);
      auVar6 = vpinsrw_avx(auVar6,2,2);
      auVar6 = vpinsrw_avx(auVar6,2,3);
      auVar6 = vpinsrw_avx(auVar6,2,4);
      auVar6 = vpinsrw_avx(auVar6,2,5);
      auVar6 = vpinsrw_avx(auVar6,2,6);
      auVar6 = vpinsrw_avx(auVar6,2,7);
      uStack_2b0 = auVar6._0_8_;
      uStack_2a8 = auVar6._8_8_;
      auVar59._8_8_ = uStack_74b8 ^ uStack_c2b8;
      auVar59._0_8_ = local_74c0 ^ local_c2c0;
      auVar59._16_8_ = uStack_74b0 ^ uStack_c2b0;
      auVar59._24_8_ = uStack_74a8 ^ uStack_c2a8;
      auVar58._8_8_ = uStack_7478 ^ uStack_c398;
      auVar58._0_8_ = local_7480 ^ local_c3a0;
      auVar58._16_8_ = uStack_7470 ^ uStack_c390;
      auVar58._24_8_ = uStack_7468 ^ uStack_c388;
      auVar11 = vpaddw_avx2(auVar59,auVar58);
      auVar61._8_8_ = uStack_7438 ^ uStack_c478;
      auVar61._0_8_ = local_7440 ^ local_c480;
      auVar61._16_8_ = uStack_7430 ^ uStack_c470;
      auVar61._24_8_ = uStack_7428 ^ uStack_c468;
      auVar60._8_8_ = uStack_73f8 ^ uStack_c558;
      auVar60._0_8_ = local_7400 ^ local_c560;
      auVar60._16_8_ = uStack_73f0 ^ uStack_c550;
      auVar60._24_8_ = uStack_73e8 ^ uStack_c548;
      auVar8 = vpaddw_avx2(auVar61,auVar60);
      auVar11 = vpaddw_avx2(auVar11,auVar8);
      auVar76._16_8_ = uStack_2b0;
      auVar76._0_16_ = auVar115;
      auVar76._24_8_ = uStack_2a8;
      auVar11 = vpmullw_avx2(auVar76,auVar11);
      auVar8 = vpaddw_avx2(local_dfc0,auVar11);
      auVar115 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar3) * 2));
      auVar6 = vlddqu_avx(*(undefined1 (*) [16])
                           (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar3) * 2));
      local_d820 = auVar115._0_8_;
      uStack_d818 = auVar115._8_8_;
      auVar115 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar3) * 2));
      auVar116 = vlddqu_avx(*(undefined1 (*) [16])
                             (in_RDX + (long)((local_df90 * 0x90 - iVar3) + 0x90) * 2));
      local_d850 = auVar115._0_8_;
      uStack_d848 = auVar115._8_8_;
      auVar115 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar5) * 2));
      auVar117 = vlddqu_avx(*(undefined1 (*) [16])
                             (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar5) * 2));
      local_d880 = auVar115._0_8_;
      uStack_d878 = auVar115._8_8_;
      auVar115 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar5) * 2));
      auVar7 = vlddqu_avx(*(undefined1 (*) [16])
                           (in_RDX + (long)((local_df90 * 0x90 - iVar5) + 0x90) * 2));
      local_d8b0 = auVar115._0_8_;
      uStack_d8a8 = auVar115._8_8_;
      auVar21._16_8_ = local_d820;
      auVar21._0_16_ = auVar6;
      auVar21._24_8_ = uStack_d818;
      auVar20._16_8_ = uStack_e050;
      auVar20._0_16_ = auVar114;
      auVar20._24_8_ = uStack_e048;
      auVar11 = vpsubw_avx2(auVar21,auVar20);
      auVar9 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_830 = auVar6._0_8_;
      uStack_828 = auVar6._8_8_;
      auVar10 = vpsrlw_avx2(auVar11,ZEXT416(local_df64));
      auVar51._16_8_ = uStack_830;
      auVar51._0_16_ = auVar115;
      auVar51._24_8_ = uStack_828;
      auVar10 = vpsubusw_avx2(auVar51,auVar10);
      local_c640 = auVar9._0_8_;
      uStack_c638 = auVar9._8_8_;
      uStack_c630 = auVar9._16_8_;
      uStack_c628 = auVar9._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar10);
      auVar11 = vpaddw_avx2(auVar9,auVar11);
      local_73c0 = auVar11._0_8_;
      uStack_73b8 = auVar11._8_8_;
      uStack_73b0 = auVar11._16_8_;
      uStack_73a8 = auVar11._24_8_;
      auVar23._16_8_ = local_d850;
      auVar23._0_16_ = auVar116;
      auVar23._24_8_ = uStack_d848;
      auVar22._16_8_ = uStack_e050;
      auVar22._0_16_ = auVar114;
      auVar22._24_8_ = uStack_e048;
      auVar11 = vpsubw_avx2(auVar23,auVar22);
      auVar9 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_7f0 = auVar6._0_8_;
      uStack_7e8 = auVar6._8_8_;
      auVar10 = vpsrlw_avx2(auVar11,ZEXT416(local_df64));
      auVar50._16_8_ = uStack_7f0;
      auVar50._0_16_ = auVar115;
      auVar50._24_8_ = uStack_7e8;
      auVar10 = vpsubusw_avx2(auVar50,auVar10);
      local_c720 = auVar9._0_8_;
      uStack_c718 = auVar9._8_8_;
      uStack_c710 = auVar9._16_8_;
      uStack_c708 = auVar9._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar10);
      auVar11 = vpaddw_avx2(auVar9,auVar11);
      local_7380 = auVar11._0_8_;
      uStack_7378 = auVar11._8_8_;
      uStack_7370 = auVar11._16_8_;
      uStack_7368 = auVar11._24_8_;
      auVar25._16_8_ = local_d880;
      auVar25._0_16_ = auVar117;
      auVar25._24_8_ = uStack_d878;
      auVar24._16_8_ = uStack_e050;
      auVar24._0_16_ = auVar114;
      auVar24._24_8_ = uStack_e048;
      auVar11 = vpsubw_avx2(auVar25,auVar24);
      auVar9 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_7b0 = auVar6._0_8_;
      uStack_7a8 = auVar6._8_8_;
      auVar10 = vpsrlw_avx2(auVar11,ZEXT416(local_df64));
      auVar49._16_8_ = uStack_7b0;
      auVar49._0_16_ = auVar115;
      auVar49._24_8_ = uStack_7a8;
      auVar10 = vpsubusw_avx2(auVar49,auVar10);
      local_c800 = auVar9._0_8_;
      uStack_c7f8 = auVar9._8_8_;
      uStack_c7f0 = auVar9._16_8_;
      uStack_c7e8 = auVar9._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar10);
      auVar11 = vpaddw_avx2(auVar9,auVar11);
      local_7340 = auVar11._0_8_;
      uStack_7338 = auVar11._8_8_;
      uStack_7330 = auVar11._16_8_;
      uStack_7328 = auVar11._24_8_;
      auVar27._16_8_ = local_d8b0;
      auVar27._0_16_ = auVar7;
      auVar27._24_8_ = uStack_d8a8;
      auVar26._16_8_ = uStack_e050;
      auVar26._0_16_ = auVar114;
      auVar26._24_8_ = uStack_e048;
      auVar11 = vpsubw_avx2(auVar27,auVar26);
      auVar9 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_770 = auVar6._0_8_;
      uStack_768 = auVar6._8_8_;
      auVar10 = vpsrlw_avx2(auVar11,ZEXT416(local_df64));
      auVar48._16_8_ = uStack_770;
      auVar48._0_16_ = auVar115;
      auVar48._24_8_ = uStack_768;
      auVar10 = vpsubusw_avx2(auVar48,auVar10);
      local_c8e0 = auVar9._0_8_;
      uStack_c8d8 = auVar9._8_8_;
      uStack_c8d0 = auVar9._16_8_;
      uStack_c8c8 = auVar9._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar10);
      auVar11 = vpaddw_avx2(auVar9,auVar11);
      local_7300 = auVar11._0_8_;
      uStack_72f8 = auVar11._8_8_;
      uStack_72f0 = auVar11._16_8_;
      uStack_72e8 = auVar11._24_8_;
      auVar115 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar115 = vpinsrw_avx(auVar115,1,2);
      auVar115 = vpinsrw_avx(auVar115,1,3);
      auVar115 = vpinsrw_avx(auVar115,1,4);
      auVar115 = vpinsrw_avx(auVar115,1,5);
      auVar115 = vpinsrw_avx(auVar115,1,6);
      auVar115 = vpinsrw_avx(auVar115,1,7);
      auVar6 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar6 = vpinsrw_avx(auVar6,1,2);
      auVar6 = vpinsrw_avx(auVar6,1,3);
      auVar6 = vpinsrw_avx(auVar6,1,4);
      auVar6 = vpinsrw_avx(auVar6,1,5);
      auVar6 = vpinsrw_avx(auVar6,1,6);
      auVar6 = vpinsrw_avx(auVar6,1,7);
      auVar116 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar115;
      uStack_270 = auVar116._0_8_;
      uStack_268 = auVar116._8_8_;
      auVar63._8_8_ = uStack_73b8 ^ uStack_c638;
      auVar63._0_8_ = local_73c0 ^ local_c640;
      auVar63._16_8_ = uStack_73b0 ^ uStack_c630;
      auVar63._24_8_ = uStack_73a8 ^ uStack_c628;
      auVar62._8_8_ = uStack_7378 ^ uStack_c718;
      auVar62._0_8_ = local_7380 ^ local_c720;
      auVar62._16_8_ = uStack_7370 ^ uStack_c710;
      auVar62._24_8_ = uStack_7368 ^ uStack_c708;
      auVar11 = vpaddw_avx2(auVar63,auVar62);
      auVar65._8_8_ = uStack_7338 ^ uStack_c7f8;
      auVar65._0_8_ = local_7340 ^ local_c800;
      auVar65._16_8_ = uStack_7330 ^ uStack_c7f0;
      auVar65._24_8_ = uStack_7328 ^ uStack_c7e8;
      auVar64._8_8_ = uStack_72f8 ^ uStack_c8d8;
      auVar64._0_8_ = local_7300 ^ local_c8e0;
      auVar64._16_8_ = uStack_72f0 ^ uStack_c8d0;
      auVar64._24_8_ = uStack_72e8 ^ uStack_c8c8;
      auVar9 = vpaddw_avx2(auVar65,auVar64);
      auVar11 = vpaddw_avx2(auVar11,auVar9);
      auVar77._16_8_ = uStack_270;
      auVar77._0_16_ = ZEXT116(0) * auVar115 + ZEXT116(1) * auVar6;
      auVar77._24_8_ = uStack_268;
      auVar11 = vpmullw_avx2(auVar77,auVar11);
      auVar11 = vpaddw_avx2(auVar8,auVar11);
      uStack_9078 = SUB328(ZEXT832(0),4);
      auVar8 = vpcmpgtw_avx2(ZEXT832(uStack_9078) << 0x40,auVar11);
      auVar11 = vpaddw_avx2(auVar11,auVar8);
      auVar115 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar115 = vpinsrw_avx(auVar115,8,2);
      auVar115 = vpinsrw_avx(auVar115,8,3);
      auVar115 = vpinsrw_avx(auVar115,8,4);
      auVar115 = vpinsrw_avx(auVar115,8,5);
      auVar115 = vpinsrw_avx(auVar115,8,6);
      auVar115 = vpinsrw_avx(auVar115,8,7);
      auVar6 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar6 = vpinsrw_avx(auVar6,8,2);
      auVar6 = vpinsrw_avx(auVar6,8,3);
      auVar6 = vpinsrw_avx(auVar6,8,4);
      auVar6 = vpinsrw_avx(auVar6,8,5);
      auVar6 = vpinsrw_avx(auVar6,8,6);
      auVar6 = vpinsrw_avx(auVar6,8,7);
      auVar116 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar115;
      uStack_2f0 = auVar116._0_8_;
      uStack_2e8 = auVar116._8_8_;
      auVar56._16_8_ = uStack_2f0;
      auVar56._0_16_ = ZEXT116(0) * auVar115 + ZEXT116(1) * auVar6;
      auVar56._24_8_ = uStack_2e8;
      auVar11 = vpaddw_avx2(auVar11,auVar56);
      auVar11 = vpsraw_avx2(auVar11,ZEXT416(4));
      auVar57._16_8_ = uStack_e050;
      auVar57._0_16_ = auVar114;
      auVar57._24_8_ = uStack_e048;
      auVar11 = vpaddw_avx2(auVar57,auVar11);
      local_e080 = auVar11._0_8_;
      uStack_e078 = auVar11._8_8_;
      puStack_e068 = auVar11._24_8_;
      *puStack_e068 = local_dad0;
      puStack_e068[1] = uStack_dac8;
      puVar1 = (undefined8 *)(in_RDI + (long)((local_df90 + 1) * in_ESI) * 2);
      *puVar1 = local_e080;
      puVar1[1] = uStack_e078;
    }
  }
  else {
    auVar115 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,2);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,3);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,4);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,5);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,6);
    vpinsrw_avx(auVar115,0xbfff,7);
    auVar115 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,2);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,3);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,4);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,5);
    auVar115 = vpinsrw_avx(auVar115,0xbfff,6);
    vpinsrw_avx(auVar115,0xbfff,7);
    iVar2 = cdef_directions_padded[(long)(in_R9D + 2) + 2][0];
    iVar3 = cdef_directions_padded[(long)(in_R9D + 2) + 2][1];
    iVar4 = cdef_directions_padded[(long)(in_R9D + -2) + 2][0];
    iVar5 = cdef_directions_padded[(long)(in_R9D + -2) + 2][1];
    local_db24 = pri_damping;
    if (in_R8D != 0) {
      iVar113 = get_msb(in_R8D);
      if (pri_damping - iVar113 < 0) {
        local_e2ac = 0;
      }
      else {
        iVar113 = get_msb(in_R8D);
        local_e2ac = pri_damping - iVar113;
      }
      local_db24 = local_e2ac;
    }
    for (local_dccc = 0; local_dccc < block_width; local_dccc = local_dccc + 4) {
      local_dc00 = ZEXT1632(ZEXT816(0));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90) * 2);
      auVar117._8_8_ = 0;
      auVar117._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90) * 2);
      auVar115 = vpunpcklqdq_avx(auVar7,auVar117);
      auVar116._8_8_ = 0;
      auVar116._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0) * 2);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120) * 2);
      auVar6 = vpunpcklqdq_avx(auVar116,auVar6);
      auVar116 = ZEXT116(0) * auVar115 + ZEXT116(1) * auVar6;
      auVar115 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar115;
      uStack_dc10 = auVar115._0_8_;
      uStack_dc08 = auVar115._8_8_;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar2) * 2);
      auVar81._8_8_ = 0;
      auVar81._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar2) * 2);
      auVar115 = vpunpcklqdq_avx(auVar82,auVar81);
      auVar80._8_8_ = 0;
      auVar80._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar2) * 2);
      auVar114._8_8_ = 0;
      auVar114._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar2) * 2);
      auVar6 = vpunpcklqdq_avx(auVar80,auVar114);
      local_17e0 = auVar115._0_8_;
      uStack_17d8 = auVar115._8_8_;
      auVar8._16_8_ = local_17e0;
      auVar8._0_16_ = auVar6;
      auVar8._24_8_ = uStack_17d8;
      auVar11._16_8_ = uStack_dc10;
      auVar11._0_16_ = auVar116;
      auVar11._24_8_ = uStack_dc08;
      auVar11 = vpsubw_avx2(auVar8,auVar11);
      auVar8 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_630 = auVar6._0_8_;
      uStack_628 = auVar6._8_8_;
      auVar9 = vpsrlw_avx2(auVar11,ZEXT416(local_db24));
      auVar47._16_8_ = uStack_630;
      auVar47._0_16_ = auVar115;
      auVar47._24_8_ = uStack_628;
      auVar9 = vpsubusw_avx2(auVar47,auVar9);
      local_cd40 = auVar8._0_8_;
      uStack_cd38 = auVar8._8_8_;
      uStack_cd30 = auVar8._16_8_;
      uStack_cd28 = auVar8._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar9);
      auVar11 = vpaddw_avx2(auVar8,auVar11);
      local_71c0 = auVar11._0_8_;
      uStack_71b8 = auVar11._8_8_;
      uStack_71b0 = auVar11._16_8_;
      uStack_71a8 = auVar11._24_8_;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar2) + 0x90) * 2);
      auVar85._8_8_ = 0;
      auVar85._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar2) * 2);
      auVar115 = vpunpcklqdq_avx(auVar86,auVar85);
      auVar84._8_8_ = 0;
      auVar84._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar2) + 0x1b0) * 2);
      auVar83._8_8_ = 0;
      auVar83._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar2) + 0x120) * 2);
      auVar6 = vpunpcklqdq_avx(auVar84,auVar83);
      local_1850 = auVar115._0_8_;
      uStack_1848 = auVar115._8_8_;
      auVar10._16_8_ = local_1850;
      auVar10._0_16_ = auVar6;
      auVar10._24_8_ = uStack_1848;
      auVar9._16_8_ = uStack_dc10;
      auVar9._0_16_ = auVar116;
      auVar9._24_8_ = uStack_dc08;
      auVar11 = vpsubw_avx2(auVar10,auVar9);
      auVar8 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_5f0 = auVar6._0_8_;
      uStack_5e8 = auVar6._8_8_;
      auVar9 = vpsrlw_avx2(auVar11,ZEXT416(local_db24));
      auVar46._16_8_ = uStack_5f0;
      auVar46._0_16_ = auVar115;
      auVar46._24_8_ = uStack_5e8;
      auVar9 = vpsubusw_avx2(auVar46,auVar9);
      local_ce20 = auVar8._0_8_;
      uStack_ce18 = auVar8._8_8_;
      uStack_ce10 = auVar8._16_8_;
      uStack_ce08 = auVar8._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar9);
      auVar11 = vpaddw_avx2(auVar8,auVar11);
      local_7180 = auVar11._0_8_;
      uStack_7178 = auVar11._8_8_;
      uStack_7170 = auVar11._16_8_;
      uStack_7168 = auVar11._24_8_;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar4) * 2);
      auVar89._8_8_ = 0;
      auVar89._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar4) * 2);
      auVar115 = vpunpcklqdq_avx(auVar90,auVar89);
      auVar88._8_8_ = 0;
      auVar88._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar4) * 2);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar4) * 2);
      auVar6 = vpunpcklqdq_avx(auVar88,auVar87);
      local_18c0 = auVar115._0_8_;
      uStack_18b8 = auVar115._8_8_;
      auVar29._16_8_ = local_18c0;
      auVar29._0_16_ = auVar6;
      auVar29._24_8_ = uStack_18b8;
      auVar28._16_8_ = uStack_dc10;
      auVar28._0_16_ = auVar116;
      auVar28._24_8_ = uStack_dc08;
      auVar11 = vpsubw_avx2(auVar29,auVar28);
      auVar8 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_5b0 = auVar6._0_8_;
      uStack_5a8 = auVar6._8_8_;
      auVar9 = vpsrlw_avx2(auVar11,ZEXT416(local_db24));
      auVar45._16_8_ = uStack_5b0;
      auVar45._0_16_ = auVar115;
      auVar45._24_8_ = uStack_5a8;
      auVar9 = vpsubusw_avx2(auVar45,auVar9);
      local_cf00 = auVar8._0_8_;
      uStack_cef8 = auVar8._8_8_;
      uStack_cef0 = auVar8._16_8_;
      uStack_cee8 = auVar8._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar9);
      auVar11 = vpaddw_avx2(auVar8,auVar11);
      local_7140 = auVar11._0_8_;
      uStack_7138 = auVar11._8_8_;
      uStack_7130 = auVar11._16_8_;
      uStack_7128 = auVar11._24_8_;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar4) + 0x90) * 2);
      auVar93._8_8_ = 0;
      auVar93._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar4) * 2);
      auVar115 = vpunpcklqdq_avx(auVar94,auVar93);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar4) + 0x1b0) * 2);
      auVar91._8_8_ = 0;
      auVar91._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar4) + 0x120) * 2);
      auVar6 = vpunpcklqdq_avx(auVar92,auVar91);
      local_1930 = auVar115._0_8_;
      uStack_1928 = auVar115._8_8_;
      auVar31._16_8_ = local_1930;
      auVar31._0_16_ = auVar6;
      auVar31._24_8_ = uStack_1928;
      auVar30._16_8_ = uStack_dc10;
      auVar30._0_16_ = auVar116;
      auVar30._24_8_ = uStack_dc08;
      auVar11 = vpsubw_avx2(auVar31,auVar30);
      auVar8 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_570 = auVar6._0_8_;
      uStack_568 = auVar6._8_8_;
      auVar9 = vpsrlw_avx2(auVar11,ZEXT416(local_db24));
      auVar44._16_8_ = uStack_570;
      auVar44._0_16_ = auVar115;
      auVar44._24_8_ = uStack_568;
      auVar9 = vpsubusw_avx2(auVar44,auVar9);
      local_cfe0 = auVar8._0_8_;
      uStack_cfd8 = auVar8._8_8_;
      uStack_cfd0 = auVar8._16_8_;
      uStack_cfc8 = auVar8._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar9);
      auVar11 = vpaddw_avx2(auVar8,auVar11);
      local_7100 = auVar11._0_8_;
      uStack_70f8 = auVar11._8_8_;
      uStack_70f0 = auVar11._16_8_;
      uStack_70e8 = auVar11._24_8_;
      auVar115 = vpinsrw_avx(ZEXT216(2),2,1);
      auVar115 = vpinsrw_avx(auVar115,2,2);
      auVar115 = vpinsrw_avx(auVar115,2,3);
      auVar115 = vpinsrw_avx(auVar115,2,4);
      auVar115 = vpinsrw_avx(auVar115,2,5);
      auVar115 = vpinsrw_avx(auVar115,2,6);
      auVar115 = vpinsrw_avx(auVar115,2,7);
      auVar6 = vpinsrw_avx(ZEXT216(2),2,1);
      auVar6 = vpinsrw_avx(auVar6,2,2);
      auVar6 = vpinsrw_avx(auVar6,2,3);
      auVar6 = vpinsrw_avx(auVar6,2,4);
      auVar6 = vpinsrw_avx(auVar6,2,5);
      auVar6 = vpinsrw_avx(auVar6,2,6);
      auVar6 = vpinsrw_avx(auVar6,2,7);
      uStack_130 = auVar6._0_8_;
      uStack_128 = auVar6._8_8_;
      auVar69._8_8_ = uStack_71b8 ^ uStack_cd38;
      auVar69._0_8_ = local_71c0 ^ local_cd40;
      auVar69._16_8_ = uStack_71b0 ^ uStack_cd30;
      auVar69._24_8_ = uStack_71a8 ^ uStack_cd28;
      auVar68._8_8_ = uStack_7178 ^ uStack_ce18;
      auVar68._0_8_ = local_7180 ^ local_ce20;
      auVar68._16_8_ = uStack_7170 ^ uStack_ce10;
      auVar68._24_8_ = uStack_7168 ^ uStack_ce08;
      auVar11 = vpaddw_avx2(auVar69,auVar68);
      auVar71._8_8_ = uStack_7138 ^ uStack_cef8;
      auVar71._0_8_ = local_7140 ^ local_cf00;
      auVar71._16_8_ = uStack_7130 ^ uStack_cef0;
      auVar71._24_8_ = uStack_7128 ^ uStack_cee8;
      auVar70._8_8_ = uStack_70f8 ^ uStack_cfd8;
      auVar70._0_8_ = local_7100 ^ local_cfe0;
      auVar70._16_8_ = uStack_70f0 ^ uStack_cfd0;
      auVar70._24_8_ = uStack_70e8 ^ uStack_cfc8;
      auVar8 = vpaddw_avx2(auVar71,auVar70);
      auVar11 = vpaddw_avx2(auVar11,auVar8);
      auVar78._16_8_ = uStack_130;
      auVar78._0_16_ = auVar115;
      auVar78._24_8_ = uStack_128;
      auVar11 = vpmullw_avx2(auVar78,auVar11);
      auVar8 = vpaddw_avx2(local_dc00,auVar11);
      auVar98._8_8_ = 0;
      auVar98._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar3) * 2);
      auVar97._8_8_ = 0;
      auVar97._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar3) * 2);
      auVar115 = vpunpcklqdq_avx(auVar98,auVar97);
      auVar96._8_8_ = 0;
      auVar96._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar3) * 2);
      auVar95._8_8_ = 0;
      auVar95._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar3) * 2);
      auVar6 = vpunpcklqdq_avx(auVar96,auVar95);
      local_19a0 = auVar115._0_8_;
      uStack_1998 = auVar115._8_8_;
      auVar33._16_8_ = local_19a0;
      auVar33._0_16_ = auVar6;
      auVar33._24_8_ = uStack_1998;
      auVar32._16_8_ = uStack_dc10;
      auVar32._0_16_ = auVar116;
      auVar32._24_8_ = uStack_dc08;
      auVar11 = vpsubw_avx2(auVar33,auVar32);
      auVar9 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_530 = auVar6._0_8_;
      uStack_528 = auVar6._8_8_;
      auVar10 = vpsrlw_avx2(auVar11,ZEXT416(local_db24));
      auVar43._16_8_ = uStack_530;
      auVar43._0_16_ = auVar115;
      auVar43._24_8_ = uStack_528;
      auVar10 = vpsubusw_avx2(auVar43,auVar10);
      local_d0c0 = auVar9._0_8_;
      uStack_d0b8 = auVar9._8_8_;
      uStack_d0b0 = auVar9._16_8_;
      uStack_d0a8 = auVar9._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar10);
      auVar11 = vpaddw_avx2(auVar9,auVar11);
      local_70c0 = auVar11._0_8_;
      uStack_70b8 = auVar11._8_8_;
      uStack_70b0 = auVar11._16_8_;
      uStack_70a8 = auVar11._24_8_;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x90) * 2);
      auVar101._8_8_ = 0;
      auVar101._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar3) * 2);
      auVar115 = vpunpcklqdq_avx(auVar102,auVar101);
      auVar100._8_8_ = 0;
      auVar100._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x1b0) * 2);
      auVar99._8_8_ = 0;
      auVar99._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x120) * 2);
      auVar6 = vpunpcklqdq_avx(auVar100,auVar99);
      local_1a10 = auVar115._0_8_;
      uStack_1a08 = auVar115._8_8_;
      auVar35._16_8_ = local_1a10;
      auVar35._0_16_ = auVar6;
      auVar35._24_8_ = uStack_1a08;
      auVar34._16_8_ = uStack_dc10;
      auVar34._0_16_ = auVar116;
      auVar34._24_8_ = uStack_dc08;
      auVar11 = vpsubw_avx2(auVar35,auVar34);
      auVar9 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_4f0 = auVar6._0_8_;
      uStack_4e8 = auVar6._8_8_;
      auVar10 = vpsrlw_avx2(auVar11,ZEXT416(local_db24));
      auVar42._16_8_ = uStack_4f0;
      auVar42._0_16_ = auVar115;
      auVar42._24_8_ = uStack_4e8;
      auVar10 = vpsubusw_avx2(auVar42,auVar10);
      local_d1a0 = auVar9._0_8_;
      uStack_d198 = auVar9._8_8_;
      uStack_d190 = auVar9._16_8_;
      uStack_d188 = auVar9._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar10);
      auVar11 = vpaddw_avx2(auVar9,auVar11);
      local_7080 = auVar11._0_8_;
      uStack_7078 = auVar11._8_8_;
      uStack_7070 = auVar11._16_8_;
      uStack_7068 = auVar11._24_8_;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar5) * 2);
      auVar105._8_8_ = 0;
      auVar105._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar5) * 2);
      auVar115 = vpunpcklqdq_avx(auVar106,auVar105);
      auVar104._8_8_ = 0;
      auVar104._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar5) * 2);
      auVar103._8_8_ = 0;
      auVar103._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar5) * 2);
      auVar6 = vpunpcklqdq_avx(auVar104,auVar103);
      local_1a80 = auVar115._0_8_;
      uStack_1a78 = auVar115._8_8_;
      auVar37._16_8_ = local_1a80;
      auVar37._0_16_ = auVar6;
      auVar37._24_8_ = uStack_1a78;
      auVar36._16_8_ = uStack_dc10;
      auVar36._0_16_ = auVar116;
      auVar36._24_8_ = uStack_dc08;
      auVar11 = vpsubw_avx2(auVar37,auVar36);
      auVar9 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_4b0 = auVar6._0_8_;
      uStack_4a8 = auVar6._8_8_;
      auVar10 = vpsrlw_avx2(auVar11,ZEXT416(local_db24));
      auVar41._16_8_ = uStack_4b0;
      auVar41._0_16_ = auVar115;
      auVar41._24_8_ = uStack_4a8;
      auVar10 = vpsubusw_avx2(auVar41,auVar10);
      local_d280 = auVar9._0_8_;
      uStack_d278 = auVar9._8_8_;
      uStack_d270 = auVar9._16_8_;
      uStack_d268 = auVar9._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar10);
      auVar11 = vpaddw_avx2(auVar9,auVar11);
      local_7040 = auVar11._0_8_;
      uStack_7038 = auVar11._8_8_;
      uStack_7030 = auVar11._16_8_;
      uStack_7028 = auVar11._24_8_;
      auVar110._8_8_ = 0;
      auVar110._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar5) + 0x90) * 2);
      auVar109._8_8_ = 0;
      auVar109._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar5) * 2);
      auVar115 = vpunpcklqdq_avx(auVar110,auVar109);
      auVar108._8_8_ = 0;
      auVar108._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar5) + 0x1b0) * 2);
      auVar107._8_8_ = 0;
      auVar107._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar5) + 0x120) * 2);
      auVar6 = vpunpcklqdq_avx(auVar108,auVar107);
      local_1af0 = auVar115._0_8_;
      uStack_1ae8 = auVar115._8_8_;
      auVar39._16_8_ = local_1af0;
      auVar39._0_16_ = auVar6;
      auVar39._24_8_ = uStack_1ae8;
      auVar38._16_8_ = uStack_dc10;
      auVar38._0_16_ = auVar116;
      auVar38._24_8_ = uStack_dc08;
      auVar11 = vpsubw_avx2(auVar39,auVar38);
      auVar9 = vpsraw_avx2(auVar11,ZEXT416(0xf));
      auVar11 = vpabsw_avx2(auVar11);
      auVar115 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,2);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,3);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,4);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,5);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,6);
      auVar115 = vpinsrw_avx(auVar115,in_R8D & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,in_R8D & 0xffff,7);
      uStack_470 = auVar6._0_8_;
      uStack_468 = auVar6._8_8_;
      auVar10 = vpsrlw_avx2(auVar11,ZEXT416(local_db24));
      auVar40._16_8_ = uStack_470;
      auVar40._0_16_ = auVar115;
      auVar40._24_8_ = uStack_468;
      auVar10 = vpsubusw_avx2(auVar40,auVar10);
      local_d360 = auVar9._0_8_;
      uStack_d358 = auVar9._8_8_;
      uStack_d350 = auVar9._16_8_;
      uStack_d348 = auVar9._24_8_;
      auVar11 = vpminsw_avx2(auVar11,auVar10);
      auVar11 = vpaddw_avx2(auVar9,auVar11);
      local_7000 = auVar11._0_8_;
      uStack_6ff8 = auVar11._8_8_;
      uStack_6ff0 = auVar11._16_8_;
      uStack_6fe8 = auVar11._24_8_;
      auVar115 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar115 = vpinsrw_avx(auVar115,1,2);
      auVar115 = vpinsrw_avx(auVar115,1,3);
      auVar115 = vpinsrw_avx(auVar115,1,4);
      auVar115 = vpinsrw_avx(auVar115,1,5);
      auVar115 = vpinsrw_avx(auVar115,1,6);
      auVar115 = vpinsrw_avx(auVar115,1,7);
      auVar6 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar6 = vpinsrw_avx(auVar6,1,2);
      auVar6 = vpinsrw_avx(auVar6,1,3);
      auVar6 = vpinsrw_avx(auVar6,1,4);
      auVar6 = vpinsrw_avx(auVar6,1,5);
      auVar6 = vpinsrw_avx(auVar6,1,6);
      auVar6 = vpinsrw_avx(auVar6,1,7);
      auVar117 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar115;
      uStack_f0 = auVar117._0_8_;
      uStack_e8 = auVar117._8_8_;
      auVar73._8_8_ = uStack_70b8 ^ uStack_d0b8;
      auVar73._0_8_ = local_70c0 ^ local_d0c0;
      auVar73._16_8_ = uStack_70b0 ^ uStack_d0b0;
      auVar73._24_8_ = uStack_70a8 ^ uStack_d0a8;
      auVar72._8_8_ = uStack_7078 ^ uStack_d198;
      auVar72._0_8_ = local_7080 ^ local_d1a0;
      auVar72._16_8_ = uStack_7070 ^ uStack_d190;
      auVar72._24_8_ = uStack_7068 ^ uStack_d188;
      auVar11 = vpaddw_avx2(auVar73,auVar72);
      auVar75._8_8_ = uStack_7038 ^ uStack_d278;
      auVar75._0_8_ = local_7040 ^ local_d280;
      auVar75._16_8_ = uStack_7030 ^ uStack_d270;
      auVar75._24_8_ = uStack_7028 ^ uStack_d268;
      auVar74._8_8_ = uStack_6ff8 ^ uStack_d358;
      auVar74._0_8_ = local_7000 ^ local_d360;
      auVar74._16_8_ = uStack_6ff0 ^ uStack_d350;
      auVar74._24_8_ = uStack_6fe8 ^ uStack_d348;
      auVar9 = vpaddw_avx2(auVar75,auVar74);
      auVar11 = vpaddw_avx2(auVar11,auVar9);
      auVar79._16_8_ = uStack_f0;
      auVar79._0_16_ = ZEXT116(0) * auVar115 + ZEXT116(1) * auVar6;
      auVar79._24_8_ = uStack_e8;
      auVar11 = vpmullw_avx2(auVar79,auVar11);
      auVar11 = vpaddw_avx2(auVar8,auVar11);
      uStack_9038 = SUB328(ZEXT832(0),4);
      auVar8 = vpcmpgtw_avx2(ZEXT832(uStack_9038) << 0x40,auVar11);
      auVar11 = vpaddw_avx2(auVar11,auVar8);
      auVar115 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar115 = vpinsrw_avx(auVar115,8,2);
      auVar115 = vpinsrw_avx(auVar115,8,3);
      auVar115 = vpinsrw_avx(auVar115,8,4);
      auVar115 = vpinsrw_avx(auVar115,8,5);
      auVar115 = vpinsrw_avx(auVar115,8,6);
      auVar115 = vpinsrw_avx(auVar115,8,7);
      auVar6 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar6 = vpinsrw_avx(auVar6,8,2);
      auVar6 = vpinsrw_avx(auVar6,8,3);
      auVar6 = vpinsrw_avx(auVar6,8,4);
      auVar6 = vpinsrw_avx(auVar6,8,5);
      auVar6 = vpinsrw_avx(auVar6,8,6);
      auVar6 = vpinsrw_avx(auVar6,8,7);
      auVar117 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar115;
      uStack_170 = auVar117._0_8_;
      uStack_168 = auVar117._8_8_;
      auVar66._16_8_ = uStack_170;
      auVar66._0_16_ = ZEXT116(0) * auVar115 + ZEXT116(1) * auVar6;
      auVar66._24_8_ = uStack_168;
      auVar11 = vpaddw_avx2(auVar11,auVar66);
      auVar11 = vpsraw_avx2(auVar11,ZEXT416(4));
      auVar67._16_8_ = uStack_dc10;
      auVar67._0_16_ = auVar116;
      auVar67._24_8_ = uStack_dc08;
      auVar11 = vpaddw_avx2(auVar67,auVar11);
      auVar115 = vpsrldq_avx(local_9210,8);
      local_9300 = auVar115._0_8_;
      *(undefined8 *)(in_RDI + (long)(local_dccc * in_ESI) * 2) = local_9300;
      uStack_1d38 = SUB168(ZEXT816(0),4);
      auVar115._8_8_ = uStack_9158;
      auVar115._0_8_ = local_9160;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = uStack_1d38;
      auVar115 = vpunpcklqdq_avx(auVar115,auVar111 << 0x40);
      local_9340 = auVar115._0_8_;
      *(undefined8 *)(in_RDI + (long)((local_dccc + 1) * in_ESI) * 2) = local_9340;
      auVar115 = vpsrldq_avx(auVar11._0_16_,8);
      local_9380 = auVar115._0_8_;
      *(undefined8 *)(in_RDI + (long)((local_dccc + 2) * in_ESI) * 2) = local_9380;
      auVar112._8_8_ = 0;
      auVar112._0_8_ = uStack_1d38;
      auVar115 = vpunpcklqdq_avx(auVar11._0_16_,auVar112 << 0x40);
      local_93c0 = auVar115._0_8_;
      *(undefined8 *)(in_RDI + (long)((local_dccc + 3) * in_ESI) * 2) = local_93c0;
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_2)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/0,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/0,
                     /*enable_secondary=*/1);
  }
}